

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v8::detail::write<char,fmt::v8::appender>
          (detail *this,appender out,basic_string_view<char> s,basic_format_specs<char> *specs)

{
  char *pcVar1;
  appender aVar2;
  count_code_points f;
  char *pcVar3;
  char *size;
  string_view s_00;
  size_t num_code_points;
  anon_class_16_2_3f014a30 local_38;
  
  f.count = (size_t *)s.size_;
  pcVar3 = s.data_;
  pcVar1 = (char *)(long)*(int *)((long)f.count + 4);
  size = pcVar3;
  if (pcVar1 < pcVar3) {
    size = pcVar1;
  }
  if ((long)pcVar1 < 0) {
    size = pcVar3;
  }
  if ((int)*f.count == 0) {
    local_38.data = (char *)0x0;
  }
  else {
    local_38.data = (char *)0x0;
    s_00.size_ = (size_t)&local_38;
    s_00.data_ = size;
    for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
              ((detail *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
               s_00,f);
  }
  pcVar1 = local_38.data;
  local_38.data = (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_38.size = (size_t)size;
  aVar2 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write<char,fmt::v8::appender>(fmt::v8::appender,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)this,(basic_format_specs<char> *)f.count,(size_t)size,(size_t)pcVar1,
                     &local_38);
  return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}